

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

DdApaDigit Cudd_ApaAdd(int digits,DdApaNumber a,DdApaNumber b,DdApaNumber sum)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)(uint)digits; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    sum[uVar1 - 1] = b[uVar1 - 1] + a[uVar1 - 1];
  }
  return 0;
}

Assistant:

DdApaDigit
Cudd_ApaAdd(
  int  digits,
  DdApaNumber  a,
  DdApaNumber  b,
  DdApaNumber  sum)
{
    int i;
    DdApaDoubleDigit partial = 0;

    for (i = digits - 1; i >= 0; i--) {
        partial = a[i] + b[i] + DD_MSDIGIT(partial);
        sum[i] = (DdApaDigit) DD_LSDIGIT(partial);
    }
    return((DdApaDigit) DD_MSDIGIT(partial));

}